

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Gia_ManBmcAddCone_rec(Bmc_Mna_t *p,Gia_Obj_t *pObj)

{
  int i;
  int iVar1;
  long lVar2;
  
  if (((uint)*(ulong *)pObj >> 0x1e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj | 0x40000000;
    i = Gia_ObjId(p->pFrames,pObj);
    lVar2 = 0x20;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar1 = Vec_IntEntry(p->vId2Var,i);
      if (iVar1 == 0) {
        Gia_ManBmcAddCone_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
        Gia_ManBmcAddCone_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
        lVar2 = 0x30;
      }
    }
    Vec_IntPush(*(Vec_Int_t **)((long)&p->pFrames + lVar2),i);
    return;
  }
  return;
}

Assistant:

void Gia_ManBmcAddCone_rec( Bmc_Mna_t * p, Gia_Obj_t * pObj )
{
    int iObj;
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    iObj = Gia_ObjId( p->pFrames, pObj );
    if ( Gia_ObjIsAnd(pObj) && Vec_IntEntry(p->vId2Var, iObj) == 0 )
    {
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin1(pObj) );
        Vec_IntPush( p->vNodes, iObj );
    }
    else
        Vec_IntPush( p->vInputs, iObj );
}